

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_file_renamed
          (torrent *this,string *filename,file_index_t file_idx,storage_error *error)

{
  _func_int *p_Var1;
  element_type *this_00;
  file_index_t index;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  file_index_t file_idx_local;
  allocator<char> local_79;
  undefined1 local_78 [40];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48;
  
  p_Var1 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[5]
  ;
  file_idx_local = file_idx;
  if ((error->ec).val_ == 0) {
    iVar2 = (*p_Var1)();
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x68) & 8) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)(local_78 + 0x20));
      index = file_idx_local;
      this_00 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_79);
      file_storage::file_path((string *)local_78,&this_00->m_files,index,&local_48);
      alert_manager::
      emplace_alert<libtorrent::file_renamed_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar2),
                 (torrent_handle *)(local_78 + 0x20),filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &file_idx_local);
      ::std::__cxx11::string::~string((string *)local_78);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50);
    }
    torrent_info::rename_file
              ((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               file_idx_local,filename);
    set_need_save_resume(this,(resume_data_flags_t)0x40);
  }
  else {
    iVar2 = (*p_Var1)();
    if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) & 8) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_78);
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_78,
                 &file_idx_local,&error->ec);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    }
  }
  return;
}

Assistant:

void torrent::on_file_renamed(std::string const& filename
		, file_index_t const file_idx
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (error)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, file_idx, error.ec);
		}
		else
		{
			if (alerts().should_post<file_renamed_alert>())
				alerts().emplace_alert<file_renamed_alert>(get_handle()
					, filename, m_torrent_file->files().file_path(file_idx), file_idx);
			m_torrent_file->rename_file(file_idx, filename);

			set_need_save_resume(torrent_handle::if_state_changed);
		}
	}
	catch (...) { handle_exception(); }